

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O1

void __thiscall CPU::LDY_AB_X(CPU *this)

{
  byte bVar1;
  uint16_t uVar2;
  int iVar3;
  
  this->cycles = 4;
  uVar2 = GetWord(this);
  this->cycles = this->cycles - 1;
  iVar3 = (*this->memory->_vptr_MemoryBus[2])(this->memory,(ulong)(ushort)(this->X + uVar2));
  bVar1 = (byte)iVar3;
  this->Y = bVar1;
  (this->field_6).ps = bVar1 & 0x80 | (bVar1 == 0) * '\x02' | (this->field_6).ps & 0x7d;
  return;
}

Assistant:

void CPU::LDY_AB_X()
{
    cycles = 4;
    uint16_t address = GetWord();
    Y = ReadByte(address + X);
    Z = (Y == 0);
    N = (Y & 0b10000000) > 0;
}